

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::Clipper::SetHoleState(Clipper *this,TEdge *e,OutRec *outRec)

{
  TEdge *pTVar1;
  bool bVar2;
  
  pTVar1 = e->prevInAEL;
  if (pTVar1 != (TEdge *)0x0) {
    bVar2 = false;
    do {
      if (-1 < (long)pTVar1->outIdx) {
        bVar2 = (bool)(bVar2 ^ 1);
        if (outRec->FirstLeft == (OutRec *)0x0) {
          outRec->FirstLeft =
               (this->m_PolyOuts).
               super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>.
               _M_impl.super__Vector_impl_data._M_start[pTVar1->outIdx];
        }
      }
      pTVar1 = pTVar1->prevInAEL;
    } while (pTVar1 != (TEdge *)0x0);
    if (bVar2) {
      outRec->isHole = true;
    }
  }
  return;
}

Assistant:

void Clipper::SetHoleState(TEdge *e, OutRec *outRec)
{
  bool isHole = false;
  TEdge *e2 = e->prevInAEL;
  while (e2)
  {
    if (e2->outIdx >= 0)
    {
      isHole = !isHole;
      if (! outRec->FirstLeft)
        outRec->FirstLeft = m_PolyOuts[e2->outIdx];
    }
    e2 = e2->prevInAEL;
  }
  if (isHole) outRec->isHole = true;
}